

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::get_image_dimensions_query_size
               (Impl *impl,Builder *builder,Id image_id,uint32_t *num_coords)

{
  uint uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  bool bVar4;
  bool bVar5;
  Id typeId;
  LoggingCallback p_Var6;
  void *pvVar7;
  ulong uVar8;
  char buffer [4096];
  char local_1018 [4096];
  
  typeId = Converter::Impl::get_type_id(impl,image_id);
  pIVar3 = (builder->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId];
  if (pIVar3->opCode == OpTypeImage) {
    uVar1 = *(uint *)(*(long *)&(pIVar3->operands).
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data + 4);
    uVar8 = (ulong)uVar1;
    bVar4 = spv::Builder::isArrayedImageType(builder,typeId);
    if ((uVar8 < 6) && ((0x2fU >> (uVar1 & 0x1f) & 1) != 0)) {
      uVar2 = *(uint32_t *)(&DAT_001c2600 + uVar8 * 4);
      *num_coords = *(uint32_t *)(&DAT_001c25e8 + uVar8 * 4);
      bVar5 = true;
      if (bVar4) {
        *num_coords = uVar2;
      }
    }
    else {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        get_image_dimensions_query_size();
      }
      else {
        builtin_strncpy(local_1018,"Unexpected sample dimensionality.\n",0x23);
        pvVar7 = get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,local_1018);
      }
      bVar5 = false;
    }
    return bVar5;
  }
  __assert_fail("isImageType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.h"
                ,0xd2,"Dim spv::Builder::getTypeDimensionality(Id) const");
}

Assistant:

bool get_image_dimensions_query_size(Converter::Impl &impl, spv::Builder &builder, spv::Id image_id,
                                     uint32_t *num_coords)
{
	spv::Id image_type_id = impl.get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool is_array = builder.isArrayedImageType(image_type_id);

	switch (dim)
	{
	case spv::Dim1D:
	case spv::DimBuffer:
		*num_coords = 1;
		break;

	case spv::Dim2D:
	case spv::DimCube:
		*num_coords = 2;
		break;

	case spv::Dim3D:
		*num_coords = 3;
		break;

	default:
		LOGE("Unexpected sample dimensionality.\n");
		return false;
	}

	if (is_array)
		(*num_coords)++;

	return true;
}